

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O3

void __thiscall DBot::Pitch(DBot *this,AActor *target)

{
  double dVar1;
  APlayerPawn *this_00;
  double dVar2;
  double dVar3;
  
  dVar3 = (target->__Pos).Z;
  this_00 = this->player->mo;
  dVar1 = (this_00->super_AActor).__Pos.Z;
  dVar2 = AActor::Distance2D(&this_00->super_AActor,target,false);
  dVar3 = c_atan((dVar3 - dVar1) / dVar2);
  (this->player->mo->super_AActor).Angles.Pitch.Degrees = dVar3 * 57.29577951308232;
  return;
}

Assistant:

void DBot::Pitch (AActor *target)
{
	double aim;
	double diff;

	diff = target->Z() - player->mo->Z();
	aim = g_atan(diff / player->mo->Distance2D(target));
	player->mo->Angles.Pitch = DAngle::ToDegrees(aim);
}